

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> * __thiscall
QAccessibleGroupBox::relations
          (QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
           *__return_storage_ptr__,QAccessibleGroupBox *this,Relation match)

{
  QWidget **ppQVar1;
  qsizetype qVar2;
  QWidget *pQVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QAccessibleInterface *iface;
  QFlagsStorage<QAccessible::RelationFlag> local_64;
  QAccessibleInterface *local_60;
  QWidgetList local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr =
       (pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *)&DAT_aaaaaaaaaaaaaaaa;
  QAccessibleWidget::relations(__return_storage_ptr__,&this->super_QAccessibleWidget,match);
  if (((uint)match.super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>.
             super_QFlagsStorage<QAccessible::RelationFlag>.i & 2) != 0) {
    pQVar3 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
    QGroupBox::title((QString *)&local_58,(QGroupBox *)pQVar3);
    qVar2 = local_58.d.size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((undefined1 *)qVar2 != (undefined1 *)0x0) {
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
      _q_ac_childWidgets(&local_58,pQVar3);
      ppQVar1 = local_58.d.ptr;
      if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
        lVar5 = local_58.d.size << 3;
        lVar4 = 0;
        do {
          local_60 = (QAccessibleInterface *)
                     QAccessible::queryAccessibleInterface(*(QObject **)((long)ppQVar1 + lVar4));
          if (local_60 != (QAccessibleInterface *)0x0) {
            local_64.i = 2;
            QtPrivate::
            QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
            emplace<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>>
                      ((QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>
                        *)__return_storage_ptr__,(__return_storage_ptr__->d).size,&local_60,
                       (QFlags<QAccessible::RelationFlag> *)&local_64);
            QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::end
                      (__return_storage_ptr__);
          }
          lVar4 = lVar4 + 8;
        } while (lVar5 != lVar4);
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<std::pair<QAccessibleInterface *, QAccessible::Relation>>
QAccessibleGroupBox::relations(QAccessible::Relation match /* = QAccessible::AllRelations */) const
{
    QList<std::pair<QAccessibleInterface *, QAccessible::Relation>> rels =
            QAccessibleWidget::relations(match);

    if ((match & QAccessible::Labelled) && (!groupBox()->title().isEmpty())) {
        const QList<QWidget*> kids = _q_ac_childWidgets(widget());
        for (QWidget *kid : kids) {
            QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(kid);
            if (iface)
                rels.emplace_back(iface, QAccessible::Relation(QAccessible::Labelled));
        }
    }
    return rels;
}